

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_SubDEdge::TopologyHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SubDEdge *this,bool bIncludeSubdivisionProperties
          )

{
  ON_SubDVertex *this_00;
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  double dVar4;
  ON_SubDFace *f;
  ON_SubDFacePtr fptr;
  ON_SubDFacePtr *pOStack_b8;
  unsigned_short efi;
  ON_SubDFacePtr *ef;
  ON_SubDVertex *v;
  ON_SubDEdgeSharpness OStack_a0;
  uint evi;
  ON_SubDEdgeSharpness s;
  ON_SHA1 sha1;
  bool bIncludeSubdivisionProperties_local;
  ON_SubDEdge *this_local;
  
  ON_SHA1::ON_SHA1((ON_SHA1 *)&s);
  ON_SHA1::AccumulateInteger32((ON_SHA1 *)&s,(this->super_ON_SubDComponentBase).m_id);
  if (bIncludeSubdivisionProperties) {
    OStack_a0 = Sharpness(this,true);
    dVar4 = ON_SubDEdgeSharpness::operator[](&stack0xffffffffffffff60,0);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)&s,dVar4);
    dVar4 = ON_SubDEdgeSharpness::operator[](&stack0xffffffffffffff60,1);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)&s,dVar4);
  }
  for (v._4_4_ = 0; v._4_4_ < 2; v._4_4_ = v._4_4_ + 1) {
    this_00 = this->m_vertex[v._4_4_];
    if (this_00 == (ON_SubDVertex *)0x0) {
      ON_SHA1::AccumulateInteger32((ON_SHA1 *)&s,-1);
    }
    else {
      ON_SHA1::AccumulateInteger32((ON_SHA1 *)&s,(this_00->super_ON_SubDComponentBase).m_id);
      if (bIncludeSubdivisionProperties) {
        ON_SHA1::AccumulateDoubleArray((ON_SHA1 *)&s,3,this_00->m_P);
        bVar2 = ON_SubDVertex::IsDartOrCreaseOrCorner(this_00);
        if (bVar2) {
          ON_SHA1::AccumulateDouble((ON_SHA1 *)&s,this->m_sector_coefficient[v._4_4_]);
        }
      }
    }
  }
  ON_SHA1::AccumulateInteger16((ON_SHA1 *)&s,this->m_face_count);
  pOStack_b8 = this->m_face2;
  for (fptr.m_ptr._6_2_ = 0; fptr.m_ptr._6_2_ < this->m_face_count;
      fptr.m_ptr._6_2_ = fptr.m_ptr._6_2_ + 1) {
    if ((fptr.m_ptr._6_2_ == 2) && (pOStack_b8 = this->m_facex, pOStack_b8 == (ON_SubDFacePtr *)0x0)
       ) goto LAB_008cde5c;
    uVar1 = pOStack_b8->m_ptr;
    uVar3 = uVar1 & 0xfffffffffffffff8;
    if (uVar3 == 0) {
      ON_SHA1::AccumulateInteger32((ON_SHA1 *)&s,-1);
    }
    else {
      ON_SHA1::AccumulateInteger32((ON_SHA1 *)&s,*(ON__INT32 *)(uVar3 + 8));
      ON_SHA1::AccumulateInteger32((ON_SHA1 *)&s,(uint)uVar1 & 1);
    }
    pOStack_b8 = pOStack_b8 + 1;
  }
LAB_008cdf35:
  ON_SHA1::Hash(__return_storage_ptr__,(ON_SHA1 *)&s);
  return __return_storage_ptr__;
LAB_008cde5c:
  for (; fptr.m_ptr._6_2_ < this->m_face_count; fptr.m_ptr._6_2_ = fptr.m_ptr._6_2_ + 1) {
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)&s,-1);
  }
  goto LAB_008cdf35;
}

Assistant:

const ON_SHA1_Hash ON_SubDEdge::TopologyHash(bool bIncludeSubdivisionProperties) const
{
  ON_SHA1 sha1;
  sha1.AccumulateInteger32(m_id);
  if (bIncludeSubdivisionProperties)
  {
    // passing true here includes the edge tag in the hash.
    const ON_SubDEdgeSharpness s = this->Sharpness(true);
    sha1.AccumulateDouble(s[0]);
    sha1.AccumulateDouble(s[1]);
  }
  for (unsigned evi = 0; evi < 2; ++evi)
  {
    const ON_SubDVertex* v = this->m_vertex[evi];    
    if (nullptr == v)
      sha1.AccumulateInteger32(ON_UNSET_UINT_INDEX);
    else
    {
      sha1.AccumulateInteger32(v->m_id);
      if (bIncludeSubdivisionProperties)
      {
        sha1.AccumulateDoubleArray(3, v->m_P);
        if (v->IsDartOrCreaseOrCorner())
          sha1.AccumulateDouble(this->m_sector_coefficient[evi]);
      }
    }
  }

  sha1.AccumulateInteger16(this->m_face_count);
  const ON_SubDFacePtr* ef = this->m_face2;
  for (unsigned short efi = 0; efi < this->m_face_count; ++efi)
  {
    if (2 == efi)
    {
      ef = this->m_facex;
      if (nullptr == ef)
      {
        while (efi < this->m_face_count)
        {
          sha1.AccumulateInteger32(ON_UNSET_UINT_INDEX);
          ++efi;
        }
        break;
      }
    }
    const ON_SubDFacePtr fptr = *ef++;
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(fptr.m_ptr);
    if (nullptr == f)
    {
      sha1.AccumulateInteger32(ON_UNSET_UINT_INDEX);
    }
    else
    {
      sha1.AccumulateInteger32(f->m_id);
      sha1.AccumulateInteger32((ON__UINT32)ON_SUBD_FACE_DIRECTION(fptr.m_ptr));
    }
  }

  return sha1.Hash();
}